

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_mesh_shading.cpp
# Opt level: O0

bool spvtools::val::IsInterfaceVariable(ValidationState_t *_,Instruction *inst,ExecutionModel model)

{
  uint32_t uVar1;
  bool bVar2;
  uint32_t uVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  reference puVar4;
  vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
  *this_00;
  reference pEVar5;
  const_iterator cStack_98;
  uint interface;
  const_iterator __end4;
  const_iterator __begin4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range4;
  EntryPointDescription *desc;
  const_iterator __end3;
  const_iterator __begin3;
  vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
  *__range3;
  _Self local_58;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *local_50;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *models;
  const_iterator cStack_40;
  uint entry_point;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  bool foundInterface;
  Instruction *pIStack_20;
  ExecutionModel model_local;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  __range2._3_1_ = 0;
  __range2._4_4_ = model;
  pIStack_20 = inst;
  inst_local = (Instruction *)_;
  this = ValidationState_t::entry_points(_);
  __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this);
  cStack_40 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this);
  do {
    bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffc0);
    if (!bVar2) {
      return (bool)(__range2._3_1_ & 1);
    }
    puVar4 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2);
    models._4_4_ = *puVar4;
    local_50 = ValidationState_t::GetExecutionModels((ValidationState_t *)inst_local,models._4_4_);
    local_58._M_node =
         (_Base_ptr)
         std::
         set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
         ::find(local_50,(key_type *)((long)&__range2 + 4));
    __range3 = (vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
                *)std::
                  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                  ::end(local_50);
    bVar2 = std::operator==(&local_58,(_Self *)&__range3);
    if (bVar2) {
      return false;
    }
    this_00 = ValidationState_t::entry_point_descriptions
                        ((ValidationState_t *)inst_local,models._4_4_);
    __end3 = std::
             vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
             ::begin(this_00);
    desc = (EntryPointDescription *)
           std::
           vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
           ::end(this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_spvtools::val::ValidationState_t::EntryPointDescription_*,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>
                                       *)&desc), bVar2) {
      pEVar5 = __gnu_cxx::
               __normal_iterator<const_spvtools::val::ValidationState_t::EntryPointDescription_*,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>
               ::operator*(&__end3);
      __end4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&pEVar5->interfaces);
      cStack_98 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&pEVar5->interfaces)
      ;
      while (bVar2 = __gnu_cxx::operator!=(&__end4,&stack0xffffffffffffff68), bVar2) {
        puVar4 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end4);
        uVar1 = *puVar4;
        uVar3 = Instruction::id(pIStack_20);
        if (uVar3 == uVar1) {
          __range2._3_1_ = 1;
          break;
        }
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end4);
      }
      __gnu_cxx::
      __normal_iterator<const_spvtools::val::ValidationState_t::EntryPointDescription_*,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>
      ::operator++(&__end3);
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

bool IsInterfaceVariable(ValidationState_t& _, const Instruction* inst,
                         spv::ExecutionModel model) {
  bool foundInterface = false;
  for (auto entry_point : _.entry_points()) {
    const auto* models = _.GetExecutionModels(entry_point);
    if (models->find(model) == models->end()) return false;
    for (const auto& desc : _.entry_point_descriptions(entry_point)) {
      for (auto interface : desc.interfaces) {
        if (inst->id() == interface) {
          foundInterface = true;
          break;
        }
      }
    }
  }
  return foundInterface;
}